

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# has_bits_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::HasBits_ConstexprValueInit_Test::
~HasBits_ConstexprValueInit_Test(HasBits_ConstexprValueInit_Test *this)

{
  HasBits_ConstexprValueInit_Test *this_local;
  
  ~HasBits_ConstexprValueInit_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HasBits, ConstexprValueInit) {
  {
    constexpr HasBits<4> bits;
    EXPECT_TRUE(bits.empty());
  }
  {
    constexpr HasBits<4> bits({});
    EXPECT_TRUE(bits.empty());
  }
  {
    constexpr HasBits<4> bits({1});
    EXPECT_FALSE(bits.empty());
    EXPECT_THAT(bits[0], Eq(1));
  }
  {
    constexpr HasBits<4> bits({1, 2, 3, 4});
    EXPECT_FALSE(bits.empty());
    EXPECT_THAT(bits[0], Eq(1));
    EXPECT_THAT(bits[1], Eq(2));
    EXPECT_THAT(bits[2], Eq(3));
    EXPECT_THAT(bits[3], Eq(4));
  }
}